

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

_Bool pathmatch(char *cookie_path,char *request_uri)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  _Bool ret;
  char *pos;
  char *uri_path;
  size_t uri_path_len;
  size_t cookie_path_len;
  char *request_uri_local;
  char *cookie_path_local;
  
  pos = (char *)0x0;
  cookie_path_len = (size_t)request_uri;
  request_uri_local = cookie_path;
  uri_path_len = strlen(cookie_path);
  if (uri_path_len == 1) {
    cookie_path_local._7_1_ = true;
  }
  else {
    pos = (*Curl_cstrdup)((char *)cookie_path_len);
    if (pos == (char *)0x0) {
      cookie_path_local._7_1_ = false;
    }
    else {
      pcVar3 = strchr(pos,0x3f);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      sVar4 = strlen(pos);
      if (((sVar4 == 0) || (*pos != '/')) && (strstore(&pos,"/",1), pos == (char *)0x0)) {
        cookie_path_local._7_1_ = false;
      }
      else {
        uri_path = (char *)strlen(pos);
        if (uri_path < uri_path_len) {
          _Var1 = false;
        }
        else {
          iVar2 = strncmp(request_uri_local,pos,uri_path_len);
          if (iVar2 == 0) {
            if ((char *)uri_path_len == uri_path) {
              _Var1 = true;
            }
            else if (pos[uri_path_len] == '/') {
              _Var1 = true;
            }
            else {
              _Var1 = false;
            }
          }
          else {
            _Var1 = false;
          }
        }
        (*Curl_cfree)(pos);
        cookie_path_local._7_1_ = _Var1;
      }
    }
  }
  return cookie_path_local._7_1_;
}

Assistant:

static bool pathmatch(const char *cookie_path, const char *request_uri)
{
  size_t cookie_path_len;
  size_t uri_path_len;
  char *uri_path = NULL;
  char *pos;
  bool ret = FALSE;

  /* cookie_path must not have last '/' separator. ex: /sample */
  cookie_path_len = strlen(cookie_path);
  if(1 == cookie_path_len) {
    /* cookie_path must be '/' */
    return TRUE;
  }

  uri_path = strdup(request_uri);
  if(!uri_path)
    return FALSE;
  pos = strchr(uri_path, '?');
  if(pos)
    *pos = 0x0;

  /* #-fragments are already cut off! */
  if(0 == strlen(uri_path) || uri_path[0] != '/') {
    strstore(&uri_path, "/", 1);
    if(!uri_path)
      return FALSE;
  }

  /*
   * here, RFC6265 5.1.4 says
   *  4. Output the characters of the uri-path from the first character up
   *     to, but not including, the right-most %x2F ("/").
   *  but URL path /hoge?fuga=xxx means /hoge/index.cgi?fuga=xxx in some site
   *  without redirect.
   *  Ignore this algorithm because /hoge is uri path for this case
   *  (uri path is not /).
   */

  uri_path_len = strlen(uri_path);

  if(uri_path_len < cookie_path_len) {
    ret = FALSE;
    goto pathmatched;
  }

  /* not using checkprefix() because matching should be case-sensitive */
  if(strncmp(cookie_path, uri_path, cookie_path_len)) {
    ret = FALSE;
    goto pathmatched;
  }

  /* The cookie-path and the uri-path are identical. */
  if(cookie_path_len == uri_path_len) {
    ret = TRUE;
    goto pathmatched;
  }

  /* here, cookie_path_len < uri_path_len */
  if(uri_path[cookie_path_len] == '/') {
    ret = TRUE;
    goto pathmatched;
  }

  ret = FALSE;

pathmatched:
  free(uri_path);
  return ret;
}